

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O3

void __thiscall
draco::AttributeQuantizationTransform::GeneratePortableAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points,PointAttribute *target_attribute)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  pointer pfVar4;
  int32_t iVar5;
  int iVar6;
  void *__dest;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  Quantizer quantizer;
  Quantizer local_6c;
  long local_68;
  ulong local_60;
  pointer local_58;
  size_t local_50;
  DataBuffer *local_48;
  long local_40;
  pointer local_38;
  
  bVar1 = (attribute->super_GeometryAttribute).num_components_;
  lVar3 = (target_attribute->super_GeometryAttribute).byte_offset_;
  local_68 = (long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar5 = this->quantization_bits_;
  Quantizer::Quantizer(&local_6c);
  Quantizer::Init(&local_6c,this->range_,~(-1 << ((byte)iVar5 & 0x1f)));
  __dest = operator_new__((ulong)((uint)bVar1 * 4));
  local_38 = (point_ids->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (long)(point_ids->
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)local_38;
  if (local_60 != 0) {
    local_60 = (long)local_60 >> 2;
    bVar2 = attribute->identity_mapping_;
    local_58 = (attribute->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (attribute->super_GeometryAttribute).byte_offset_;
    local_48 = (attribute->super_GeometryAttribute).buffer_;
    local_50 = (attribute->super_GeometryAttribute).byte_stride_;
    pfVar4 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = local_68 + lVar3;
    uVar7 = 0;
    iVar6 = 0;
    do {
      uVar8 = (ulong)local_38[uVar7].value_;
      if (bVar2 == false) {
        uVar8 = (ulong)local_58[uVar8].value_;
      }
      memcpy(__dest,(void *)((long)(local_48->data_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_40 +
                            uVar8 * local_50),local_50);
      if ((ulong)bVar1 != 0) {
        lVar3 = local_68 + (long)iVar6 * 4;
        uVar8 = 0;
        do {
          fVar9 = floorf((*(float *)((long)__dest + uVar8 * 4) - pfVar4[uVar8]) *
                         local_6c.inverse_delta_ + 0.5);
          *(int *)(lVar3 + uVar8 * 4) = (int)fVar9;
          uVar8 = uVar8 + 1;
        } while (bVar1 != uVar8);
        iVar6 = iVar6 + (int)uVar8;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < local_60);
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void AttributeQuantizationTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    int num_points, PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  const int num_components = attribute.num_components();

  // Quantize all values using the order given by point_ids.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  const uint32_t max_quantized_value = (1 << (quantization_bits_)) - 1;
  Quantizer quantizer;
  quantizer.Init(range(), max_quantized_value);
  int32_t dst_index = 0;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  for (uint32_t i = 0; i < point_ids.size(); ++i) {
    const AttributeValueIndex att_val_id = attribute.mapped_index(point_ids[i]);
    attribute.GetValue(att_val_id, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      const float value = (att_val[c] - min_values()[c]);
      const int32_t q_val = quantizer.QuantizeFloat(value);
      portable_attribute_data[dst_index++] = q_val;
    }
  }
}